

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O2

int os_locate(char *fname,int flen,char *arg0,char *buf,size_t bufsiz)

{
  size_t __n;
  long lVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = access(fname,0);
  if (iVar2 == 0) {
    memcpy(buf,fname,(long)flen);
    buf[flen] = '\0';
  }
  else {
    if (arg0 == (char *)0x0) {
      return 0;
    }
    if (*arg0 == '\0') {
      return 0;
    }
    sVar3 = strlen(arg0);
    sVar3 = sVar3 + 1;
    do {
      if (arg0 + (sVar3 - 1) <= arg0) {
        return 0;
      }
      __n = sVar3 - 1;
      lVar1 = sVar3 - 2;
      sVar3 = __n;
    } while (arg0[lVar1] != '/');
    memcpy(buf,arg0,__n);
    memcpy(buf + __n,fname,(long)flen);
    (buf + __n)[flen] = '\0';
    iVar2 = access(buf,0);
    if (iVar2 != 0) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int os_locate(const char *fname, int flen, const char *arg0,
              char *buf, size_t bufsiz)
{
    /* Check the current directory */
    if (osfacc(fname) == 0)
    {
        memcpy(buf, fname, flen);
        buf[flen] = 0;
        return(1);
    }
    
    /* Check the program directory */
    if (arg0 && *arg0)
    {
        const char *p;
        
        /* find the end of the directory name of argv[0] */
        for (p = arg0 + strlen(arg0); p > arg0 && !ispathchar(*(p-1)); --p) ;
        
        /* don't bother if there's no directory on argv[0] */
        if (p > arg0)
        {
            size_t  len = (size_t)(p - arg0);
            
            memcpy(buf, arg0, len);
            memcpy(buf+len, fname, flen);
            buf[len+flen] = 0;
            if (osfacc(buf) == 0) return(1);
        }
    }
    
#ifdef USE_PATHSEARCH
    /* Check TADS path */
    if ( pathfind(fname, flen, "TADS", buf, bufsiz) )
        return(1);
#endif /* USE_PATHSEARCH */
    
    return(0);
}